

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O1

value * __thiscall
mjs::string_object::internal_value(value *__return_storage_ptr__,string_object *this)

{
  gc_heap *local_20;
  uint32_t local_18;
  
  string_value((string_object *)&stack0xffffffffffffffe0);
  __return_storage_ptr__->type_ = string;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = local_20;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_18;
  if (local_20 != (gc_heap *)0x0) {
    gc_heap::attach(local_20,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

value internal_value() const override {
        return value{string_value()};
    }